

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerMeshless.cpp
# Opt level: O1

void __thiscall
chrono::ChProximityContainerMeshless::RemoveAllProximities(ChProximityContainerMeshless *this)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->proximitylist).
                super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->proximitylist; p_Var1 = p_Var1->_M_next) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 8))();
    }
    p_Var1[1]._M_next = (_List_node_base *)0x0;
  }
  std::__cxx11::list<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
  ::clear(&this->proximitylist);
  (this->lastproximity)._M_node =
       (this->proximitylist).
       super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  this->n_added = 0;
  return;
}

Assistant:

void ChProximityContainerMeshless::RemoveAllProximities() {
    std::list<ChProximityMeshless*>::iterator iterproximity = proximitylist.begin();
    while (iterproximity != proximitylist.end()) {
        delete (*iterproximity);
        (*iterproximity) = 0;
        ++iterproximity;
        // proximitylist.erase(iterproximity); //no! do later with clear(), all together
    }
    proximitylist.clear();

    lastproximity = proximitylist.begin();
    n_added = 0;
}